

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alp_compress.hpp
# Opt level: O2

void duckdb::AlpCompress<float>(CompressionState *state_p,Vector *scan_vector,idx_t count)

{
  UnifiedVectorFormat vdata;
  UnifiedVectorFormat UStack_68;
  
  UnifiedVectorFormat::UnifiedVectorFormat(&UStack_68);
  Vector::ToUnifiedFormat(scan_vector,count,&UStack_68);
  AlpCompressionState<float>::Append((AlpCompressionState<float> *)state_p,&UStack_68,count);
  UnifiedVectorFormat::~UnifiedVectorFormat(&UStack_68);
  return;
}

Assistant:

void AlpCompress(CompressionState &state_p, Vector &scan_vector, idx_t count) {
	auto &state = (AlpCompressionState<T> &)state_p;
	UnifiedVectorFormat vdata;
	scan_vector.ToUnifiedFormat(count, vdata);
	state.Append(vdata, count);
}